

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m256i *ptr;
  __m256i *palVar10;
  __m256i *ptr_00;
  int64_t *ptr_01;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  int32_t segNum;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  ulong size;
  __m256i *palVar41;
  long lVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  ulong uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar67 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar36 = profile->s1Len;
        if ((int)uVar36 < 1) {
          parasail_nw_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_64_cold_1();
        }
        else {
          iVar25 = uVar36 - 1;
          size = (ulong)uVar36 + 3 >> 2;
          iVar40 = (int)size;
          uVar15 = (ulong)(uint)open;
          iVar29 = -open;
          iVar8 = ppVar3->min;
          uVar28 = 0x8000000000000000 - (long)iVar8;
          if (iVar8 != iVar29 && SBORROW4(iVar8,iVar29) == iVar8 + open < 0) {
            uVar28 = uVar15 | 0x8000000000000000;
          }
          iVar8 = ppVar3->max;
          ppVar9 = parasail_result_new();
          if (ppVar9 != (parasail_result_t *)0x0) {
            ppVar9->flag = ppVar9->flag | 0x4800801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar10 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar10 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar6 = s2Len + -1;
              iVar7 = 3 - iVar25 / iVar40;
              auVar85 = ZEXT2864(CONCAT424(open,CONCAT420(0,CONCAT416(open,CONCAT412(0,CONCAT48(open
                                                  ,uVar15))))));
              uVar24 = (ulong)(uint)gap;
              auVar60 = ZEXT2864(CONCAT424(gap,CONCAT420(0,CONCAT416(gap,CONCAT412(0,CONCAT48(gap,
                                                  uVar24))))));
              lVar42 = uVar28 + 1;
              lVar16 = 0x7ffffffffffffffe - (long)iVar8;
              auVar48._8_8_ = lVar42;
              auVar48._0_8_ = lVar42;
              auVar48._16_8_ = lVar42;
              auVar48._24_8_ = lVar42;
              auVar65._8_8_ = lVar16;
              auVar65._0_8_ = lVar16;
              auVar65._16_8_ = lVar16;
              auVar65._24_8_ = lVar16;
              auVar67 = ZEXT3264(auVar65);
              lVar16 = (long)iVar29;
              uVar28 = 0;
              do {
                lVar32 = 0;
                lVar42 = lVar16;
                do {
                  local_80[lVar32] = lVar42;
                  local_a0[lVar32] = lVar42 - uVar15;
                  lVar32 = lVar32 + 1;
                  lVar42 = lVar42 - size * uVar24;
                } while (lVar32 != 4);
                palVar41 = ptr + uVar28;
                (*palVar41)[0] = local_80[0];
                (*palVar41)[1] = local_80[1];
                (*palVar41)[2] = local_80[2];
                (*palVar41)[3] = local_80[3];
                palVar41 = ptr_00 + uVar28;
                (*palVar41)[0] = local_a0[0];
                (*palVar41)[1] = local_a0[1];
                (*palVar41)[2] = local_a0[2];
                (*palVar41)[3] = local_a0[3];
                uVar28 = uVar28 + 1;
                lVar16 = lVar16 - uVar24;
              } while (uVar28 != size);
              *ptr_01 = 0;
              lVar16 = (long)iVar29;
              uVar28 = 1;
              do {
                ptr_01[uVar28] = lVar16;
                uVar28 = uVar28 + 1;
                lVar16 = lVar16 - uVar24;
              } while (s2Len + 1 != uVar28);
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = (ulong)(uint)s2Len;
              }
              lVar16 = (ulong)(iVar40 + (uint)(iVar40 == 0)) << 5;
              uVar24 = 0;
              auVar70 = ZEXT3264(auVar48);
              auVar78 = auVar48;
              do {
                palVar41 = ptr;
                ptr = palVar10;
                auVar61 = SUB3216(palVar41[iVar40 - 1],0);
                auVar74._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar78._0_16_;
                auVar74._16_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar61;
                auVar78 = vpalignr_avx2((undefined1  [32])palVar41[iVar40 - 1],auVar74,8);
                iVar8 = ppVar3->mapper[(byte)s2[uVar24]];
                auVar78 = vpblendd_avx2(auVar78,ZEXT832((ulong)ptr_01[uVar24]),3);
                lVar42 = 0;
                auVar63 = ZEXT3264(auVar48);
                do {
                  auVar78 = vpaddq_avx2(auVar78,*(undefined1 (*) [32])
                                                 ((long)pvVar2 + lVar42 + size * (long)iVar8 * 0x20)
                                       );
                  uVar23 = *(ulong *)((long)*ptr_00 + lVar42);
                  uVar17 = auVar78._0_8_;
                  if ((long)auVar78._0_8_ <= (long)uVar23) {
                    uVar17 = uVar23;
                  }
                  uVar27 = *(ulong *)((long)*ptr_00 + lVar42 + 8);
                  uVar20 = vpextrq_avx(auVar78._0_16_,1);
                  if ((long)uVar20 <= (long)uVar27) {
                    uVar20 = uVar27;
                  }
                  uVar22 = *(ulong *)((long)*ptr_00 + lVar42 + 0x10);
                  uVar35 = auVar78._16_8_;
                  if ((long)auVar78._16_8_ <= (long)uVar22) {
                    uVar35 = uVar22;
                  }
                  uVar34 = *(ulong *)((long)*ptr_00 + lVar42 + 0x18);
                  uVar30 = vpextrq_avx(auVar78._16_16_,1);
                  if ((long)uVar30 <= (long)uVar34) {
                    uVar30 = uVar34;
                  }
                  uVar19 = auVar63._0_8_;
                  if ((long)uVar17 <= (long)uVar19) {
                    uVar17 = uVar19;
                  }
                  uVar11 = vpextrq_avx(auVar63._0_16_,1);
                  if ((long)uVar20 <= (long)uVar11) {
                    uVar20 = uVar11;
                  }
                  uVar71 = auVar63._16_8_;
                  if ((long)uVar35 <= (long)uVar71) {
                    uVar35 = uVar71;
                  }
                  uVar12 = vpextrq_avx(auVar63._16_16_,1);
                  if ((long)uVar30 <= (long)uVar12) {
                    uVar30 = uVar12;
                  }
                  uVar37 = auVar70._0_8_;
                  if ((long)auVar70._0_8_ <= (long)uVar17) {
                    uVar37 = uVar17;
                  }
                  uVar33 = vpextrq_avx(auVar70._0_16_,1);
                  if ((long)uVar33 <= (long)uVar20) {
                    uVar33 = uVar20;
                  }
                  uVar26 = auVar70._16_8_;
                  if ((long)auVar70._16_8_ <= (long)uVar35) {
                    uVar26 = uVar35;
                  }
                  uVar13 = vpextrq_avx(auVar70._16_16_,1);
                  if ((long)uVar13 <= (long)uVar30) {
                    uVar13 = uVar30;
                  }
                  uVar18 = uVar17;
                  if ((long)auVar67._0_8_ < (long)uVar17) {
                    uVar18 = auVar67._0_8_;
                  }
                  uVar38 = vpextrq_avx(auVar67._0_16_,1);
                  uVar21 = uVar20;
                  if ((long)uVar38 < (long)uVar20) {
                    uVar21 = uVar38;
                  }
                  uVar38 = uVar35;
                  if ((long)auVar67._16_8_ < (long)uVar35) {
                    uVar38 = auVar67._16_8_;
                  }
                  uVar39 = vpextrq_avx(auVar67._16_16_,1);
                  uVar31 = uVar30;
                  if ((long)uVar39 < (long)uVar30) {
                    uVar31 = uVar39;
                  }
                  if ((long)uVar23 <= (long)uVar18) {
                    uVar18 = uVar23;
                  }
                  if ((long)uVar27 <= (long)uVar21) {
                    uVar21 = uVar27;
                  }
                  if ((long)uVar22 <= (long)uVar38) {
                    uVar38 = uVar22;
                  }
                  if ((long)uVar34 <= (long)uVar31) {
                    uVar31 = uVar34;
                  }
                  if ((long)uVar19 <= (long)uVar18) {
                    uVar18 = uVar19;
                  }
                  auVar61._8_8_ = 0;
                  auVar61._0_8_ = uVar35;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = uVar30;
                  auVar61 = vpunpcklqdq_avx(auVar61,auVar80);
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar17;
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar20;
                  auVar72 = vpunpcklqdq_avx(auVar72,auVar76);
                  auVar78._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72;
                  auVar78._16_16_ = ZEXT116(1) * auVar61;
                  if ((long)uVar11 <= (long)uVar21) {
                    uVar21 = uVar11;
                  }
                  if ((long)uVar71 <= (long)uVar38) {
                    uVar38 = uVar71;
                  }
                  if ((long)uVar12 <= (long)uVar31) {
                    uVar31 = uVar12;
                  }
                  auVar84 = auVar85._0_32_;
                  auVar74 = vpsubq_avx2(auVar78,auVar84);
                  auVar59 = auVar60._0_32_;
                  auVar75 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr_00 + lVar42),auVar59);
                  uVar23 = auVar74._0_8_;
                  uVar17 = auVar75._0_8_;
                  if ((long)auVar75._0_8_ <= (long)uVar23) {
                    uVar17 = uVar23;
                  }
                  uVar20 = vpextrq_avx(auVar75._0_16_,1);
                  uVar27 = vpextrq_avx(auVar74._0_16_,1);
                  if ((long)uVar20 <= (long)uVar27) {
                    uVar20 = uVar27;
                  }
                  uVar22 = auVar74._16_8_;
                  uVar35 = auVar75._16_8_;
                  if ((long)auVar75._16_8_ <= (long)uVar22) {
                    uVar35 = uVar22;
                  }
                  uVar30 = vpextrq_avx(auVar75._16_16_,1);
                  uVar34 = vpextrq_avx(auVar74._16_16_,1);
                  if ((long)uVar30 <= (long)uVar34) {
                    uVar30 = uVar34;
                  }
                  auVar74 = vpsubq_avx2(auVar63._0_32_,auVar59);
                  if ((long)uVar23 < (long)auVar74._0_8_) {
                    uVar23 = auVar74._0_8_;
                  }
                  uVar19 = vpextrq_avx(auVar74._0_16_,1);
                  if ((long)uVar27 < (long)uVar19) {
                    uVar27 = uVar19;
                  }
                  if ((long)uVar22 < (long)auVar74._16_8_) {
                    uVar22 = auVar74._16_8_;
                  }
                  uVar19 = vpextrq_avx(auVar74._16_16_,1);
                  if ((long)uVar34 < (long)uVar19) {
                    uVar34 = uVar19;
                  }
                  *(undefined1 (*) [32])((long)*ptr + lVar42) = auVar78;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = uVar13;
                  auVar68._8_8_ = 0;
                  auVar68._0_8_ = uVar26;
                  auVar61 = vpunpcklqdq_avx(auVar68,auVar5);
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = uVar33;
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = uVar37;
                  auVar72 = vpunpcklqdq_avx(auVar73,auVar4);
                  auVar70 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar61,
                                                ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72));
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = uVar31;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar38;
                  auVar61 = vpunpcklqdq_avx(auVar82,auVar81);
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar21;
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = uVar18;
                  auVar72 = vpunpcklqdq_avx(auVar86,auVar64);
                  auVar67 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                ZEXT116(1) * auVar61,
                                                ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72));
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = uVar20;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = uVar17;
                  auVar61 = vpunpcklqdq_avx(auVar88,auVar87);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar35;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar30;
                  auVar72 = vpunpcklqdq_avx(auVar49,auVar79);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar42 + 0x10) = auVar72;
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar42) = auVar61;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar22;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = uVar34;
                  auVar61 = vpunpcklqdq_avx(auVar44,auVar62);
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = uVar27;
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = uVar23;
                  auVar72 = vpunpcklqdq_avx(auVar83,auVar77);
                  auVar85 = ZEXT3264(auVar84);
                  auVar60 = ZEXT3264(auVar59);
                  auVar63 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar61,
                                                ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72));
                  auVar78 = *(undefined1 (*) [32])((long)*palVar41 + lVar42);
                  lVar42 = lVar42 + 0x20;
                } while (lVar16 != lVar42);
                uVar36 = 0;
                do {
                  auVar78 = vpermq_avx2(auVar63._0_32_,0x90);
                  auVar78 = vpblendd_avx2(auVar78,ZEXT832(ptr_01[uVar24 + 1] - uVar15),3);
                  auVar63 = ZEXT3264(auVar78);
                  bVar43 = true;
                  uVar23 = 1;
                  lVar42 = 0;
                  do {
                    uVar17 = *(ulong *)((long)*ptr + lVar42);
                    uVar27 = auVar63._0_8_;
                    if ((long)auVar63._0_8_ < (long)uVar17) {
                      uVar27 = uVar17;
                    }
                    uVar20 = vpextrq_avx(auVar63._0_16_,1);
                    uVar17 = *(ulong *)((long)*ptr + lVar42 + 8);
                    if ((long)uVar20 < (long)uVar17) {
                      uVar20 = uVar17;
                    }
                    uVar17 = *(ulong *)((long)*ptr + lVar42 + 0x10);
                    uVar22 = auVar63._16_8_;
                    if ((long)auVar63._16_8_ < (long)uVar17) {
                      uVar22 = uVar17;
                    }
                    uVar35 = vpextrq_avx(auVar63._16_16_,1);
                    uVar17 = *(ulong *)((long)*ptr + lVar42 + 0x18);
                    if ((long)uVar35 < (long)uVar17) {
                      uVar35 = uVar17;
                    }
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar35;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar22;
                    auVar61 = vpunpcklqdq_avx(auVar50,auVar45);
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = uVar20;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar27;
                    auVar72 = vpunpcklqdq_avx(auVar56,auVar51);
                    auVar75._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72;
                    auVar75._16_16_ = ZEXT116(1) * auVar61;
                    *(undefined1 (*) [32])((long)*ptr + lVar42) = auVar75;
                    uVar17 = auVar67._0_8_;
                    if ((long)uVar27 <= (long)auVar67._0_8_) {
                      uVar17 = uVar27;
                    }
                    uVar34 = vpextrq_avx(auVar67._0_16_,1);
                    if ((long)uVar20 <= (long)uVar34) {
                      uVar34 = uVar20;
                    }
                    uVar30 = auVar67._16_8_;
                    if ((long)uVar22 <= (long)auVar67._16_8_) {
                      uVar30 = uVar22;
                    }
                    uVar19 = vpextrq_avx(auVar67._16_16_,1);
                    if ((long)uVar35 <= (long)uVar19) {
                      uVar19 = uVar35;
                    }
                    if ((long)uVar27 < (long)auVar70._0_8_) {
                      uVar27 = auVar70._0_8_;
                    }
                    uVar11 = vpextrq_avx(auVar70._0_16_,1);
                    if ((long)uVar20 < (long)uVar11) {
                      uVar20 = uVar11;
                    }
                    if ((long)uVar22 < (long)auVar70._16_8_) {
                      uVar22 = auVar70._16_8_;
                    }
                    uVar11 = vpextrq_avx(auVar70._16_16_,1);
                    if ((long)uVar11 <= (long)uVar35) {
                      uVar11 = uVar35;
                    }
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar19;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = uVar30;
                    auVar61 = vpunpcklqdq_avx(auVar52,auVar46);
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = uVar34;
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = uVar17;
                    auVar72 = vpunpcklqdq_avx(auVar57,auVar53);
                    auVar66._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72;
                    auVar66._16_16_ = ZEXT116(1) * auVar61;
                    auVar67._0_32_ = auVar66;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar11;
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = uVar22;
                    auVar61 = vpunpcklqdq_avx(auVar54,auVar47);
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = uVar20;
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = uVar27;
                    auVar72 = vpunpcklqdq_avx(auVar58,auVar55);
                    auVar69._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar72;
                    auVar69._16_16_ = ZEXT116(1) * auVar61;
                    auVar70._0_32_ = auVar69;
                    auVar78 = vpsubq_avx2(auVar75,auVar84);
                    auVar74 = vpsubq_avx2(auVar63._0_32_,auVar59);
                    auVar63 = ZEXT3264(auVar74);
                    auVar78 = vpcmpgtq_avx2(auVar74,auVar78);
                    if ((((auVar78 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar78 >> 0x7f,0) == '\0') && SUB321(auVar78 >> 0xbf,0) == '\0') &&
                        -1 < auVar78[0x1f]) break;
                    bVar43 = uVar23 < size;
                    lVar42 = lVar42 + 0x20;
                    uVar23 = uVar23 + 1;
                  } while (lVar16 != lVar42);
                } while ((!bVar43) && (bVar43 = uVar36 < 3, uVar36 = uVar36 + 1, bVar43));
                uVar24 = uVar24 + 1;
                palVar10 = palVar41;
                if (uVar24 == uVar28) {
                  alVar1 = ptr[(uint)(iVar25 % iVar40)];
                  auVar61 = alVar1._16_16_;
                  if (iVar25 / iVar40 < 3) {
                    iVar8 = 1;
                    if (1 < iVar7) {
                      iVar8 = iVar7;
                    }
                    do {
                      auVar78 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8)
                      ;
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar78,8);
                      auVar61 = alVar1._16_16_;
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                  auVar48 = vpcmpgtq_avx2(auVar48,auVar66);
                  auVar65 = vpcmpgtq_avx2(auVar69,auVar65);
                  auVar48 = vpor_avx2(auVar65,auVar48);
                  if ((((auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       SUB321(auVar48 >> 0x7f,0) == '\0') && SUB321(auVar48 >> 0xbf,0) == '\0') &&
                      -1 < auVar48[0x1f]) {
                    uVar14 = vpextrq_avx(auVar61,1);
                    iVar8 = (int)uVar14;
                  }
                  else {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    iVar8 = 0;
                    iVar6 = 0;
                    iVar25 = 0;
                  }
                  ppVar9->score = iVar8;
                  ppVar9->end_query = iVar25;
                  ppVar9->end_ref = iVar6;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar41);
                  parasail_free(ptr);
                  return ppVar9;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}